

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O3

void __thiscall QtMWidgets::Stepper::setValue(Stepper *this,int val)

{
  int iVar1;
  int iVar2;
  StepperPrivate *this_00;
  
  this_00 = (this->d).d;
  iVar1 = this_00->minimum;
  iVar2 = this_00->value;
  if (val < iVar1) {
    val = iVar1;
    if (this_00->wrapping != false) {
      val = this_00->maximum;
    }
  }
  else if ((this_00->maximum < val) && (val = this_00->maximum, this_00->wrapping != false)) {
    val = iVar1;
  }
  this_00->value = val;
  StepperPrivate::enableButtons(this_00);
  iVar1 = ((this->d).d)->value;
  if (iVar2 != iVar1) {
    valueChanged(this,iVar1);
    return;
  }
  return;
}

Assistant:

void
Stepper::setValue( int val )
{
	const int old = d->value;

	d->value = d->bound( val );

	d->enableButtons();

	if( old != d->value )
		emit valueChanged( d->value );
}